

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64_stage9_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  int *piVar1;
  uint *puVar2;
  __m128i *palVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i alVar7;
  __m128i alVar8;
  __m128i alVar9;
  __m128i alVar10;
  __m128i alVar11;
  __m128i alVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  longlong lVar17;
  __m128i *palVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  undefined1 auVar23 [16];
  undefined1 auVar30 [16];
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  palVar18 = u;
  for (lVar20 = 0xf0; lVar20 != 0x70; lVar20 = lVar20 + -0x10) {
    iVar21 = (int)(*palVar18)[0];
    iVar24 = *(int *)((long)*palVar18 + 4);
    iVar26 = (int)(*palVar18)[1];
    iVar28 = *(int *)((long)*palVar18 + 0xc);
    piVar1 = (int *)((long)*u + lVar20);
    iVar31 = *piVar1 + iVar21;
    iVar33 = piVar1[1] + iVar24;
    iVar35 = piVar1[2] + iVar26;
    iVar37 = piVar1[3] + iVar28;
    iVar21 = iVar21 - *piVar1;
    iVar24 = iVar24 - piVar1[1];
    iVar26 = iVar26 - piVar1[2];
    iVar28 = iVar28 - piVar1[3];
    iVar16 = (int)(*clamp_lo)[0];
    iVar13 = *(int *)((long)*clamp_lo + 4);
    iVar14 = (int)(*clamp_lo)[1];
    iVar15 = *(int *)((long)*clamp_lo + 0xc);
    uVar32 = (uint)(iVar31 < iVar16) * iVar16 | (uint)(iVar31 >= iVar16) * iVar31;
    uVar34 = (uint)(iVar33 < iVar13) * iVar13 | (uint)(iVar33 >= iVar13) * iVar33;
    uVar36 = (uint)(iVar35 < iVar14) * iVar14 | (uint)(iVar35 >= iVar14) * iVar35;
    uVar38 = (uint)(iVar37 < iVar15) * iVar15 | (uint)(iVar37 >= iVar15) * iVar37;
    iVar31 = (int)(*clamp_hi)[0];
    iVar33 = *(int *)((long)*clamp_hi + 4);
    iVar35 = (int)(*clamp_hi)[1];
    iVar37 = *(int *)((long)*clamp_hi + 0xc);
    uVar22 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
    uVar25 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
    uVar27 = (uint)(iVar26 < iVar14) * iVar14 | (uint)(iVar26 >= iVar14) * iVar26;
    uVar29 = (uint)(iVar28 < iVar15) * iVar15 | (uint)(iVar28 >= iVar15) * iVar28;
    *(uint *)*palVar18 = (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
    *(uint *)((long)*palVar18 + 4) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    *(uint *)(*palVar18 + 1) =
         (uint)(iVar35 < (int)uVar36) * iVar35 | (iVar35 >= (int)uVar36) * uVar36;
    *(uint *)((long)*palVar18 + 0xc) =
         (uint)(iVar37 < (int)uVar38) * iVar37 | (iVar37 >= (int)uVar38) * uVar38;
    puVar2 = (uint *)((long)*u + lVar20);
    *puVar2 = (uint)(iVar31 < (int)uVar22) * iVar31 | (iVar31 >= (int)uVar22) * uVar22;
    puVar2[1] = (uint)(iVar33 < (int)uVar25) * iVar33 | (iVar33 >= (int)uVar25) * uVar25;
    puVar2[2] = (uint)(iVar35 < (int)uVar27) * iVar35 | (iVar35 >= (int)uVar27) * uVar27;
    puVar2[3] = (uint)(iVar37 < (int)uVar29) * iVar37 | (iVar37 >= (int)uVar29) * uVar29;
    palVar18 = palVar18 + 1;
  }
  alVar4 = *cospim32;
  alVar5 = u[0x14];
  alVar6 = u[0x15];
  alVar7 = u[0x16];
  auVar39 = pmulld((undefined1  [16])alVar5,(undefined1  [16])alVar4);
  alVar8 = *cospi32;
  alVar9 = u[0x1b];
  auVar30 = pmulld((undefined1  [16])alVar9,(undefined1  [16])alVar8);
  iVar21 = (int)(*rnding)[0];
  iVar24 = *(int *)((long)*rnding + 4);
  iVar26 = (int)(*rnding)[1];
  iVar28 = *(int *)((long)*rnding + 0xc);
  auVar40 = ZEXT416((uint)bit);
  alVar10 = u[0x17];
  auVar41 = pmulld((undefined1  [16])alVar6,(undefined1  [16])alVar4);
  alVar11 = u[0x1a];
  auVar42 = pmulld((undefined1  [16])alVar11,(undefined1  [16])alVar8);
  auVar43 = pmulld((undefined1  [16])alVar7,(undefined1  [16])alVar4);
  alVar12 = u[0x19];
  auVar46 = pmulld((undefined1  [16])alVar12,(undefined1  [16])alVar8);
  auVar23 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar10);
  alVar4 = u[0x18];
  auVar49 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar8);
  auVar47._0_4_ = (int)alVar4[0] + (int)alVar10[0];
  auVar47._4_4_ = alVar4[0]._4_4_ + alVar10[0]._4_4_;
  auVar47._8_4_ = (int)alVar4[1] + (int)alVar10[1];
  auVar47._12_4_ = alVar4[1]._4_4_ + alVar10[1]._4_4_;
  auVar48 = pmulld(auVar47,(undefined1  [16])alVar8);
  auVar45._0_4_ = (int)alVar12[0] + (int)alVar7[0];
  auVar45._4_4_ = alVar12[0]._4_4_ + alVar7[0]._4_4_;
  auVar45._8_4_ = (int)alVar12[1] + (int)alVar7[1];
  auVar45._12_4_ = alVar12[1]._4_4_ + alVar7[1]._4_4_;
  *(int *)u[0x18] = auVar48._0_4_ + iVar21 >> auVar40;
  *(int *)((long)u[0x18] + 4) = auVar48._4_4_ + iVar24 >> auVar40;
  *(int *)(u[0x18] + 1) = auVar48._8_4_ + iVar26 >> auVar40;
  *(int *)((long)u[0x18] + 0xc) = auVar48._12_4_ + iVar28 >> auVar40;
  auVar48 = pmulld(auVar45,(undefined1  [16])*cospi32);
  iVar16 = *(int *)((long)*rnding + 4);
  lVar17 = (*rnding)[1];
  iVar13 = *(int *)((long)*rnding + 0xc);
  auVar44._0_4_ = (int)alVar11[0] + (int)alVar6[0];
  auVar44._4_4_ = alVar11[0]._4_4_ + alVar6[0]._4_4_;
  auVar44._8_4_ = (int)alVar11[1] + (int)alVar6[1];
  auVar44._12_4_ = alVar11[1]._4_4_ + alVar6[1]._4_4_;
  *(int *)u[0x19] = auVar48._0_4_ + (int)(*rnding)[0] >> auVar40;
  *(int *)((long)u[0x19] + 4) = auVar48._4_4_ + iVar16 >> auVar40;
  *(int *)(u[0x19] + 1) = auVar48._8_4_ + (int)lVar17 >> auVar40;
  *(int *)((long)u[0x19] + 0xc) = auVar48._12_4_ + iVar13 >> auVar40;
  auVar44 = pmulld(auVar44,(undefined1  [16])*cospi32);
  iVar16 = *(int *)((long)*rnding + 4);
  lVar17 = (*rnding)[1];
  iVar13 = *(int *)((long)*rnding + 0xc);
  auVar48._0_4_ = (int)alVar9[0] + (int)alVar5[0];
  auVar48._4_4_ = alVar9[0]._4_4_ + alVar5[0]._4_4_;
  auVar48._8_4_ = (int)alVar9[1] + (int)alVar5[1];
  auVar48._12_4_ = alVar9[1]._4_4_ + alVar5[1]._4_4_;
  *(int *)u[0x1a] = auVar44._0_4_ + (int)(*rnding)[0] >> auVar40;
  *(int *)((long)u[0x1a] + 4) = auVar44._4_4_ + iVar16 >> auVar40;
  *(int *)(u[0x1a] + 1) = auVar44._8_4_ + (int)lVar17 >> auVar40;
  *(int *)((long)u[0x1a] + 0xc) = auVar44._12_4_ + iVar13 >> auVar40;
  auVar48 = pmulld(auVar48,(undefined1  [16])*cospi32);
  iVar16 = *(int *)((long)*rnding + 4);
  lVar17 = (*rnding)[1];
  iVar13 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x1b] = auVar48._0_4_ + (int)(*rnding)[0] >> auVar40;
  *(int *)((long)u[0x1b] + 4) = auVar48._4_4_ + iVar16 >> auVar40;
  *(int *)(u[0x1b] + 1) = auVar48._8_4_ + (int)lVar17 >> auVar40;
  *(int *)((long)u[0x1b] + 0xc) = auVar48._12_4_ + iVar13 >> auVar40;
  *(int *)u[0x14] = auVar30._0_4_ + auVar39._0_4_ + iVar21 >> auVar40;
  *(int *)((long)u[0x14] + 4) = auVar30._4_4_ + auVar39._4_4_ + iVar24 >> auVar40;
  *(int *)(u[0x14] + 1) = auVar30._8_4_ + auVar39._8_4_ + iVar26 >> auVar40;
  *(int *)((long)u[0x14] + 0xc) = auVar30._12_4_ + auVar39._12_4_ + iVar28 >> auVar40;
  *(int *)u[0x15] = auVar41._0_4_ + iVar21 + auVar42._0_4_ >> auVar40;
  *(int *)((long)u[0x15] + 4) = auVar41._4_4_ + iVar24 + auVar42._4_4_ >> auVar40;
  *(int *)(u[0x15] + 1) = auVar41._8_4_ + iVar26 + auVar42._8_4_ >> auVar40;
  *(int *)((long)u[0x15] + 0xc) = auVar41._12_4_ + iVar28 + auVar42._12_4_ >> auVar40;
  *(int *)u[0x16] = auVar43._0_4_ + iVar21 + auVar46._0_4_ >> auVar40;
  *(int *)((long)u[0x16] + 4) = auVar43._4_4_ + iVar24 + auVar46._4_4_ >> auVar40;
  *(int *)(u[0x16] + 1) = auVar43._8_4_ + iVar26 + auVar46._8_4_ >> auVar40;
  *(int *)((long)u[0x16] + 0xc) = auVar43._12_4_ + iVar28 + auVar46._12_4_ >> auVar40;
  *(int *)u[0x17] = auVar23._0_4_ + iVar21 + auVar49._0_4_ >> auVar40;
  *(int *)((long)u[0x17] + 4) = auVar23._4_4_ + iVar24 + auVar49._4_4_ >> auVar40;
  *(int *)(u[0x17] + 1) = auVar23._8_4_ + iVar26 + auVar49._8_4_ >> auVar40;
  *(int *)((long)u[0x17] + 0xc) = auVar23._12_4_ + iVar28 + auVar49._12_4_ >> auVar40;
  palVar18 = u + 0x20;
  for (uVar19 = 0x20; uVar19 != 0x28; uVar19 = uVar19 + 1) {
    iVar21 = (int)(*palVar18)[0];
    iVar24 = *(int *)((long)*palVar18 + 4);
    iVar26 = (int)(*palVar18)[1];
    iVar28 = *(int *)((long)*palVar18 + 0xc);
    palVar3 = u + (uVar19 ^ 0xf);
    iVar16 = (int)(*palVar3)[0];
    iVar13 = *(int *)((long)*palVar3 + 4);
    iVar14 = (int)(*palVar3)[1];
    iVar15 = *(int *)((long)*palVar3 + 0xc);
    iVar31 = iVar16 + iVar21;
    iVar33 = iVar13 + iVar24;
    iVar35 = iVar14 + iVar26;
    iVar37 = iVar15 + iVar28;
    iVar21 = iVar21 - iVar16;
    iVar24 = iVar24 - iVar13;
    iVar26 = iVar26 - iVar14;
    iVar28 = iVar28 - iVar15;
    iVar16 = (int)(*clamp_lo)[0];
    iVar13 = *(int *)((long)*clamp_lo + 4);
    iVar14 = (int)(*clamp_lo)[1];
    iVar15 = *(int *)((long)*clamp_lo + 0xc);
    uVar32 = (uint)(iVar31 < iVar16) * iVar16 | (uint)(iVar31 >= iVar16) * iVar31;
    uVar34 = (uint)(iVar33 < iVar13) * iVar13 | (uint)(iVar33 >= iVar13) * iVar33;
    uVar36 = (uint)(iVar35 < iVar14) * iVar14 | (uint)(iVar35 >= iVar14) * iVar35;
    uVar38 = (uint)(iVar37 < iVar15) * iVar15 | (uint)(iVar37 >= iVar15) * iVar37;
    iVar31 = (int)(*clamp_hi)[0];
    iVar33 = *(int *)((long)*clamp_hi + 4);
    iVar35 = (int)(*clamp_hi)[1];
    iVar37 = *(int *)((long)*clamp_hi + 0xc);
    uVar22 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
    uVar25 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
    uVar27 = (uint)(iVar26 < iVar14) * iVar14 | (uint)(iVar26 >= iVar14) * iVar26;
    uVar29 = (uint)(iVar28 < iVar15) * iVar15 | (uint)(iVar28 >= iVar15) * iVar28;
    *(uint *)*palVar18 = (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
    *(uint *)((long)*palVar18 + 4) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    *(uint *)(*palVar18 + 1) =
         (uint)(iVar35 < (int)uVar36) * iVar35 | (iVar35 >= (int)uVar36) * uVar36;
    *(uint *)((long)*palVar18 + 0xc) =
         (uint)(iVar37 < (int)uVar38) * iVar37 | (iVar37 >= (int)uVar38) * uVar38;
    palVar3 = u + (uVar19 ^ 0xf);
    *(uint *)*palVar3 = (uint)(iVar31 < (int)uVar22) * iVar31 | (iVar31 >= (int)uVar22) * uVar22;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(iVar33 < (int)uVar25) * iVar33 | (iVar33 >= (int)uVar25) * uVar25;
    *(uint *)(*palVar3 + 1) =
         (uint)(iVar35 < (int)uVar27) * iVar35 | (iVar35 >= (int)uVar27) * uVar27;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(iVar37 < (int)uVar29) * iVar37 | (iVar37 >= (int)uVar29) * uVar29;
    palVar18 = palVar18 + 1;
  }
  palVar18 = u + 0x30;
  for (uVar19 = 0x30; uVar19 != 0x38; uVar19 = uVar19 + 1) {
    palVar3 = u + (uVar19 ^ 0xf);
    iVar21 = (int)(*palVar3)[0];
    iVar24 = *(int *)((long)*palVar3 + 4);
    iVar26 = (int)(*palVar3)[1];
    iVar28 = *(int *)((long)*palVar3 + 0xc);
    iVar16 = (int)(*palVar18)[0];
    iVar13 = *(int *)((long)*palVar18 + 4);
    iVar14 = (int)(*palVar18)[1];
    iVar15 = *(int *)((long)*palVar18 + 0xc);
    iVar31 = iVar16 + iVar21;
    iVar33 = iVar13 + iVar24;
    iVar35 = iVar14 + iVar26;
    iVar37 = iVar15 + iVar28;
    iVar21 = iVar21 - iVar16;
    iVar24 = iVar24 - iVar13;
    iVar26 = iVar26 - iVar14;
    iVar28 = iVar28 - iVar15;
    iVar16 = (int)(*clamp_lo)[0];
    iVar13 = *(int *)((long)*clamp_lo + 4);
    iVar14 = (int)(*clamp_lo)[1];
    iVar15 = *(int *)((long)*clamp_lo + 0xc);
    uVar32 = (uint)(iVar31 < iVar16) * iVar16 | (uint)(iVar31 >= iVar16) * iVar31;
    uVar34 = (uint)(iVar33 < iVar13) * iVar13 | (uint)(iVar33 >= iVar13) * iVar33;
    uVar36 = (uint)(iVar35 < iVar14) * iVar14 | (uint)(iVar35 >= iVar14) * iVar35;
    uVar38 = (uint)(iVar37 < iVar15) * iVar15 | (uint)(iVar37 >= iVar15) * iVar37;
    iVar31 = (int)(*clamp_hi)[0];
    iVar33 = *(int *)((long)*clamp_hi + 4);
    iVar35 = (int)(*clamp_hi)[1];
    iVar37 = *(int *)((long)*clamp_hi + 0xc);
    uVar22 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
    uVar25 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
    uVar27 = (uint)(iVar26 < iVar14) * iVar14 | (uint)(iVar26 >= iVar14) * iVar26;
    uVar29 = (uint)(iVar28 < iVar15) * iVar15 | (uint)(iVar28 >= iVar15) * iVar28;
    palVar3 = u + (uVar19 ^ 0xf);
    *(uint *)*palVar3 = (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    *(uint *)(*palVar3 + 1) =
         (uint)(iVar35 < (int)uVar36) * iVar35 | (iVar35 >= (int)uVar36) * uVar36;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(iVar37 < (int)uVar38) * iVar37 | (iVar37 >= (int)uVar38) * uVar38;
    *(uint *)*palVar18 = (uint)(iVar31 < (int)uVar22) * iVar31 | (iVar31 >= (int)uVar22) * uVar22;
    *(uint *)((long)*palVar18 + 4) =
         (uint)(iVar33 < (int)uVar25) * iVar33 | (iVar33 >= (int)uVar25) * uVar25;
    *(uint *)(*palVar18 + 1) =
         (uint)(iVar35 < (int)uVar27) * iVar35 | (iVar35 >= (int)uVar27) * uVar27;
    *(uint *)((long)*palVar18 + 0xc) =
         (uint)(iVar37 < (int)uVar29) * iVar37 | (iVar37 >= (int)uVar29) * uVar29;
    palVar18 = palVar18 + 1;
  }
  return;
}

Assistant:

static inline void idct64_stage9_sse4_1(__m128i *u, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rnding, int bit) {
  int i;
  __m128i temp1, temp2, temp3, temp4;
  for (i = 0; i < 8; ++i) {
    addsub_sse4_1(u[i], u[15 - i], &u[i], &u[15 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim32, &u[20], cospi32, &u[27], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[21], cospi32, &u[26], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[22], cospi32, &u[25], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[23], cospi32, &u[24], rnding, bit);
  u[24] = half_btf_sse4_1(cospi32, &u[23], cospi32, &u[24], rnding, bit);
  u[25] = half_btf_sse4_1(cospi32, &u[22], cospi32, &u[25], rnding, bit);
  u[26] = half_btf_sse4_1(cospi32, &u[21], cospi32, &u[26], rnding, bit);
  u[27] = half_btf_sse4_1(cospi32, &u[20], cospi32, &u[27], rnding, bit);
  u[20] = temp1;
  u[21] = temp2;
  u[22] = temp3;
  u[23] = temp4;
  for (i = 32; i < 40; i++) {
    addsub_sse4_1(u[i], u[i ^ 15], &u[i], &u[i ^ 15], clamp_lo, clamp_hi);
  }

  for (i = 48; i < 56; i++) {
    addsub_sse4_1(u[i ^ 15], u[i], &u[i ^ 15], &u[i], clamp_lo, clamp_hi);
  }
}